

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowBase.cpp
# Opt level: O3

bool __thiscall sf::WindowBase::filterEvent(WindowBase *this,Event *event)

{
  if (event->type == Resized) {
    (this->m_size).x = (event->field_1).size.width;
    (this->m_size).y = (event->field_1).size.height;
    (*this->_vptr_WindowBase[6])();
  }
  return true;
}

Assistant:

bool WindowBase::filterEvent(const Event& event)
{
    // Notify resize events to the derived class
    if (event.type == Event::Resized)
    {
        // Cache the new size
        m_size.x = event.size.width;
        m_size.y = event.size.height;

        // Notify the derived class
        onResize();
    }

    return true;
}